

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

QString * __thiscall
QTextDocumentPrivate::plainText(QString *__return_storage_ptr__,QTextDocumentPrivate *this)

{
  FragmentMap *this_00;
  uint uVar1;
  Data *pDVar2;
  Header *pHVar3;
  QTextFragmentData *pQVar4;
  uint n;
  char16_t *pcVar5;
  char16_t *__dest;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = &this->fragments;
  QFragmentMapData<QTextFragmentData>::length(&this_00->data,0);
  QString::resize((longlong)__return_storage_ptr__);
  pcVar5 = (this->text).d.ptr;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = (char16_t *)&QString::_empty;
  }
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  __dest = (__return_storage_ptr__->d).ptr;
  pHVar3 = (this_00->data).field_0.head;
  uVar1 = pHVar3->root;
  do {
    n = uVar1;
    if (n == 0) goto LAB_004d3f80;
    uVar1 = *(uint *)((long)pHVar3 + (ulong)n * 0x20 + 4);
  } while (uVar1 != 0);
  do {
    pQVar4 = (this_00->data).field_0.fragments;
    memcpy(__dest,pcVar5 + pQVar4[n].stringPosition,
           (ulong)pQVar4[n].super_QFragment<1>.size_array[0] * 2);
    __dest = __dest + pQVar4[n].super_QFragment<1>.size_array[0];
    n = QFragmentMapData<QTextFragmentData>::next(&this_00->data,n);
  } while (n != 0);
LAB_004d3f80:
  QString::chop((longlong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QString QTextDocumentPrivate::plainText() const
{
    QString result;
    result.resize(length());
    const QChar *text_unicode = text.unicode();
    QChar *data = result.data();
    for (QTextDocumentPrivate::FragmentIterator it = begin(); it != end(); ++it) {
        const QTextFragmentData *f = *it;
        ::memcpy(data, text_unicode + f->stringPosition, f->size_array[0] * sizeof(QChar));
        data += f->size_array[0];
    }
    // remove trailing block separator
    result.chop(1);
    return result;
}